

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountEvent.h
# Opt level: O0

void __thiscall
async_simple::coro::detail::CountEvent::CountEvent(CountEvent *this,CountEvent *other)

{
  coroutine_handle<void> cVar1;
  undefined8 *in_RSI;
  atomic<unsigned_long> *in_RDI;
  coroutine_handle<void> *in_stack_ffffffffffffff98;
  
  LOCK();
  *in_RSI = 0;
  UNLOCK();
  std::atomic<unsigned_long>::atomic(in_RDI,(__integral_type_conflict)in_stack_ffffffffffffff98);
  cVar1 = std::exchange<std::coroutine_handle<void>,decltype(nullptr)>
                    (in_stack_ffffffffffffff98,(void **)0x67b8b0);
  in_RDI[1].super___atomic_base<unsigned_long>._M_i = (__int_type)cVar1.__handle_;
  return;
}

Assistant:

CountEvent(CountEvent&& other)
        : _count(other._count.exchange(0, std::memory_order_relaxed)),
          _awaitingCoro(std::exchange(other._awaitingCoro, nullptr)) {}